

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NscParserRoutines.cpp
# Opt level: O0

CNscPStackEntry * NscBuildMarkLine(int nIndex,CNscPStackEntry *pStatement)

{
  bool bVar1;
  NscType NVar2;
  CNscPStackEntry *in_RSI;
  int in_EDI;
  CNscPStackEntry *unaff_retaddr;
  undefined8 in_stack_fffffffffffffff8;
  
  if (in_RSI == (CNscPStackEntry *)0x0) {
    in_RSI = (CNscPStackEntry *)0x0;
  }
  else {
    bVar1 = CNscContext::IsPhase2(g_pCtx);
    if (((bVar1) || (bVar1 = CNscContext::IsNWScript(g_pCtx), bVar1)) &&
       (NVar2 = CNscPStackEntry::GetType(in_RSI), NVar2 != NscType_Error)) {
      CNscContext::GetFile(g_pCtx,in_EDI);
      CNscContext::GetLine(g_pCtx,in_EDI);
      CNscPStackEntry::PushLine
                (unaff_retaddr,(int)((ulong)in_stack_fffffffffffffff8 >> 0x20),
                 (int)in_stack_fffffffffffffff8);
    }
  }
  return in_RSI;
}

Assistant:

YYSTYPE NscBuildMarkLine (int nIndex, YYSTYPE pStatement)
{
	//
	// If the statement is NULL, then do a simple return
	//

	if (pStatement == NULL)
		return NULL;

	//
	// If this is phase1 and we are in a function, do nothing
	//

	if (!g_pCtx ->IsPhase2 () && !g_pCtx ->IsNWScript ())
	{
		return pStatement;
	}
	
	//
	// Check for silent errors
	//

	if (pStatement ->GetType () == NscType_Error)
	{
	}

	//
	// Otherwise, add the line marker
	//

	else
	{
		pStatement ->PushLine (g_pCtx ->GetFile (nIndex), 
			g_pCtx ->GetLine (nIndex));
	}

	//
	// Return results
	//

	return pStatement;
}